

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_exists(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  int iVar2;
  char *__name;
  Value local_90;
  undefined1 local_79;
  undefined1 local_78 [7];
  bool found;
  String pathStr;
  Value local_60 [2];
  String local_40;
  undefined1 local_30 [8];
  Value path;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_40,"path");
  MiniScript::Context::GetVar((Context *)local_30,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  bVar1 = MiniScript::Value::IsNull((Value *)local_30);
  if (bVar1) {
    MiniScript::Value::Value(local_60,(Value *)MiniScript::Value::null);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,local_60,true);
    MiniScript::Value::~Value(local_60);
    pathStr._12_4_ = 1;
  }
  else {
    MiniScript::Value::ToString((Value *)local_78,(Machine *)local_30);
    __name = MiniScript::String::c_str((String *)local_78);
    iVar2 = access(__name,0);
    local_79 = iVar2 != -1;
    MiniScript::Value::Truth(&local_90,(bool)local_79);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_90,true);
    MiniScript::Value::~Value(&local_90);
    pathStr._12_4_ = 1;
    MiniScript::String::~String((String *)local_78);
  }
  MiniScript::Value::~Value((Value *)local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exists(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::null);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char pathBuf[512];
		_fullpath(pathBuf, pathStr.c_str(), sizeof(pathBuf));
		WIN32_FIND_DATA FindFileData;
		HANDLE handle = FindFirstFile(pathBuf, &FindFileData) ;
		bool found = handle != INVALID_HANDLE_VALUE;
		if (found) FindClose(handle);
	#else
		bool found = (access(pathStr.c_str(), F_OK ) != -1);
	#endif
	return IntrinsicResult(Value::Truth(found));
}